

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

int arena_i_oversize_threshold_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  void *pvVar1;
  ulong uVar2;
  size_t __n;
  size_t oldval;
  
  if (mib[1] >> 0x20 != 0) {
    return 0xe;
  }
  pvVar1 = duckdb_je_arenas[mib[1]].repr;
  if (pvVar1 == (void *)0x0) {
    return 0xe;
  }
  if (oldlenp != (size_t *)0x0 && oldp != (void *)0x0) {
    oldval = *(size_t *)((long)pvVar1 + 0x10ed0);
    uVar2 = *oldlenp;
    if (uVar2 != 8) {
      __n = 8;
      if (uVar2 < 8) {
        __n = uVar2;
      }
      switchD_00916250::default(oldp,&oldval,__n);
      *oldlenp = __n;
      return 0x16;
    }
    *(size_t *)oldp = oldval;
  }
  if (newp != (void *)0x0) {
    if (newlen != 8) {
      return 0x16;
    }
    *(undefined8 *)((long)pvVar1 + 0x10ed0) = *newp;
    return 0;
  }
  return 0;
}

Assistant:

static int
arena_i_oversize_threshold_ctl(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;

	unsigned arena_ind;
	MIB_UNSIGNED(arena_ind, 1);

	arena_t *arena = arena_get(tsd_tsdn(tsd), arena_ind, false);
	if (arena == NULL) {
		ret = EFAULT;
		goto label_return;
	}

	if (oldp != NULL && oldlenp != NULL) {
		size_t oldval = atomic_load_zu(
		    &arena->pa_shard.pac.oversize_threshold, ATOMIC_RELAXED);
		READ(oldval, size_t);
	}
	if (newp != NULL) {
		if (newlen != sizeof(size_t)) {
			ret = EINVAL;
			goto label_return;
		}
		atomic_store_zu(&arena->pa_shard.pac.oversize_threshold,
		    *(size_t *)newp, ATOMIC_RELAXED);
	}
	ret = 0;
label_return:
	return ret;
}